

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall duckdb::WriteAheadLog::WriteCreateView(WriteAheadLog *this,ViewCatalogEntry *entry)

{
  ViewCatalogEntry *local_5c0;
  WriteAheadLogSerializer serializer;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&serializer,this,CREATE_VIEW);
  local_5c0 = entry;
  Serializer::WriteProperty<duckdb::ViewCatalogEntry_const*>
            (&serializer.serializer.super_Serializer,0x65,"view",&local_5c0);
  WriteAheadLogSerializer::End(&serializer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&serializer);
  return;
}

Assistant:

void WriteAheadLog::WriteCreateView(const ViewCatalogEntry &entry) {
	WriteAheadLogSerializer serializer(*this, WALType::CREATE_VIEW);
	serializer.WriteProperty(101, "view", &entry);
	serializer.End();
}